

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
internalSetData<int>
          (Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int data)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  bool result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  RepType local_30;
  int local_c;
  
  local_c = in_ESI;
  std::__cxx11::string::string((string *)&local_30);
  bVar1 = ParameterTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::convert<int>(local_c,&local_30);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x30),(string *)&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }